

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

void __thiscall
duckdb::FunctionExpression::Serialize(FunctionExpression *this,Serializer *serializer)

{
  ParsedExpression::Serialize(&this->super_ParsedExpression,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,200,"function_name",&this->function_name);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xc9,"schema",&this->schema)
  ;
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (serializer,0xca,"children",&this->children);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xcb,"filter",&this->filter);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::OrderModifier,std::default_delete<duckdb::OrderModifier>,true>>
            (serializer,0xcc,"order_bys",&this->order_bys);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xcd,"distinct",&this->distinct);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xce,"is_operator",&this->is_operator);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xcf,"export_state",&this->export_state);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xd0,"catalog",&this->catalog);
  return;
}

Assistant:

void FunctionExpression::Serialize(Serializer &serializer) const {
	ParsedExpression::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "function_name", function_name);
	serializer.WritePropertyWithDefault<string>(201, "schema", schema);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(202, "children", children);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(203, "filter", filter);
	serializer.WritePropertyWithDefault<unique_ptr<OrderModifier>>(204, "order_bys", order_bys);
	serializer.WritePropertyWithDefault<bool>(205, "distinct", distinct);
	serializer.WritePropertyWithDefault<bool>(206, "is_operator", is_operator);
	serializer.WritePropertyWithDefault<bool>(207, "export_state", export_state);
	serializer.WritePropertyWithDefault<string>(208, "catalog", catalog);
}